

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::BatchNorm_x86_avx::forward_inplace(BatchNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [32];
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  float *pfVar16;
  undefined1 (*pauVar17) [32];
  int iVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  float in_register_0000129c;
  undefined1 in_ZMM3 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  auVar5 = _DAT_003185e0;
  auVar22 = _DAT_003185c0;
  iVar9 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar9 == 2) {
      iVar10 = bottom_top_blob->h;
      if (0 < (long)iVar10) {
        iVar15 = bottom_top_blob->w;
        pp_Var6 = this->_vptr_BatchNorm_x86_avx;
        lVar14 = 0;
        do {
          if (0 < iVar15) {
            auVar21 = *(undefined1 (*) [16])
                       (*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar14 * 0x10);
            auVar23 = *(undefined1 (*) [16])
                       (*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar14 * 0x10);
            pfVar16 = (float *)(bottom_top_blob->w * lVar14 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            iVar18 = iVar15;
            do {
              *pfVar16 = auVar23._0_4_ * *pfVar16 + auVar21._0_4_;
              pfVar16[1] = auVar23._4_4_ * pfVar16[1] + auVar21._4_4_;
              pfVar16[2] = auVar23._8_4_ * pfVar16[2] + auVar21._8_4_;
              pfVar16[3] = auVar23._12_4_ * pfVar16[3] + auVar21._12_4_;
              pfVar16 = pfVar16 + 4;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != iVar10);
      }
    }
    else if ((iVar9 == 1) && (iVar10 = bottom_top_blob->w, 0 < (long)iVar10)) {
      pp_Var6 = this->_vptr_BatchNorm_x86_avx;
      lVar14 = 0;
      do {
        pfVar16 = (float *)((long)bottom_top_blob->data + lVar14);
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar14);
        pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar14);
        auVar21._0_4_ = *pfVar16 * *pfVar1 + *pfVar2;
        auVar21._4_4_ = pfVar16[1] * pfVar1[1] + pfVar2[1];
        auVar21._8_4_ = pfVar16[2] * pfVar1[2] + pfVar2[2];
        auVar21._12_4_ = pfVar16[3] * pfVar1[3] + pfVar2[3];
        *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar14) = auVar21;
        lVar14 = lVar14 + 0x10;
      } while ((long)iVar10 * 0x10 != lVar14);
    }
    if ((iVar9 - 3U < 2) && (iVar9 = bottom_top_blob->c, 0 < (long)iVar9)) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var6 = this->_vptr_BatchNorm_x86_avx;
      lVar14 = 0;
      do {
        if (0 < iVar10) {
          auVar21 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar14 * 0x10);
          auVar23 = *(undefined1 (*) [16])
                     (*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar14 * 0x10);
          pfVar16 = (float *)(bottom_top_blob->cstep * lVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar15 = iVar10;
          do {
            *pfVar16 = auVar23._0_4_ * *pfVar16 + auVar21._0_4_;
            pfVar16[1] = auVar23._4_4_ * pfVar16[1] + auVar21._4_4_;
            pfVar16[2] = auVar23._8_4_ * pfVar16[2] + auVar21._8_4_;
            pfVar16[3] = auVar23._12_4_ * pfVar16[3] + auVar21._12_4_;
            pfVar16 = pfVar16 + 4;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != iVar9);
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar9 == 2) {
      iVar10 = bottom_top_blob->h;
      if (0 < (long)iVar10) {
        iVar15 = bottom_top_blob->w;
        pp_Var6 = this->_vptr_BatchNorm_x86_avx;
        lVar14 = 0;
        do {
          if (0 < iVar15) {
            auVar22 = *(undefined1 (*) [32])
                       (*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar14 * 0x20);
            auVar5 = *(undefined1 (*) [32])
                      (*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar14 * 0x20);
            pfVar16 = (float *)(bottom_top_blob->w * lVar14 * bottom_top_blob->elemsize +
                               (long)bottom_top_blob->data);
            iVar18 = iVar15;
            do {
              in_register_0000129c = in_register_0000129c + auVar22._28_4_;
              *pfVar16 = auVar5._0_4_ * *pfVar16 + auVar22._0_4_;
              pfVar16[1] = auVar5._4_4_ * pfVar16[1] + auVar22._4_4_;
              pfVar16[2] = auVar5._8_4_ * pfVar16[2] + auVar22._8_4_;
              pfVar16[3] = auVar5._12_4_ * pfVar16[3] + auVar22._12_4_;
              pfVar16[4] = auVar5._16_4_ * pfVar16[4] + auVar22._16_4_;
              pfVar16[5] = auVar5._20_4_ * pfVar16[5] + auVar22._20_4_;
              pfVar16[6] = auVar5._24_4_ * pfVar16[6] + auVar22._24_4_;
              pfVar16[7] = in_register_0000129c;
              pfVar16 = pfVar16 + 8;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != iVar10);
      }
    }
    else if ((iVar9 == 1) && (iVar10 = bottom_top_blob->w, 0 < (long)iVar10)) {
      pp_Var6 = this->_vptr_BatchNorm_x86_avx;
      lVar14 = 0;
      do {
        pfVar16 = (float *)((long)bottom_top_blob->data + lVar14);
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar14);
        pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar14);
        auVar22._0_4_ = *pfVar16 * *pfVar1 + *pfVar2;
        auVar22._4_4_ = pfVar16[1] * pfVar1[1] + pfVar2[1];
        auVar22._8_4_ = pfVar16[2] * pfVar1[2] + pfVar2[2];
        auVar22._12_4_ = pfVar16[3] * pfVar1[3] + pfVar2[3];
        auVar22._16_4_ = pfVar16[4] * pfVar1[4] + pfVar2[4];
        auVar22._20_4_ = pfVar16[5] * pfVar1[5] + pfVar2[5];
        auVar22._24_4_ = pfVar16[6] * pfVar1[6] + pfVar2[6];
        auVar22._28_4_ = pfVar16[7] + pfVar2[7];
        *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar14) = auVar22;
        lVar14 = lVar14 + 0x20;
      } while ((long)iVar10 * 0x20 != lVar14);
    }
    if ((iVar9 - 3U < 2) && (iVar9 = bottom_top_blob->c, 0 < (long)iVar9)) {
      iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var6 = this->_vptr_BatchNorm_x86_avx;
      lVar14 = 0;
      do {
        if (0 < iVar10) {
          auVar22 = *(undefined1 (*) [32])
                     (*(long *)(&this->field_0x1f8 + (long)pp_Var6[-3]) + lVar14 * 0x20);
          auVar5 = *(undefined1 (*) [32])
                    (*(long *)(&this->field_0x240 + (long)pp_Var6[-3]) + lVar14 * 0x20);
          pfVar16 = (float *)(bottom_top_blob->cstep * lVar14 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          iVar15 = iVar10;
          do {
            in_register_0000129c = in_register_0000129c + auVar22._28_4_;
            *pfVar16 = auVar5._0_4_ * *pfVar16 + auVar22._0_4_;
            pfVar16[1] = auVar5._4_4_ * pfVar16[1] + auVar22._4_4_;
            pfVar16[2] = auVar5._8_4_ * pfVar16[2] + auVar22._8_4_;
            pfVar16[3] = auVar5._12_4_ * pfVar16[3] + auVar22._12_4_;
            pfVar16[4] = auVar5._16_4_ * pfVar16[4] + auVar22._16_4_;
            pfVar16[5] = auVar5._20_4_ * pfVar16[5] + auVar22._20_4_;
            pfVar16[6] = auVar5._24_4_ * pfVar16[6] + auVar22._24_4_;
            pfVar16[7] = in_register_0000129c;
            pfVar16 = pfVar16 + 8;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != iVar9);
    }
  }
  else {
    if (iVar9 - 5U < 0xfffffffe) {
      iVar9 = BatchNorm::forward_inplace
                        ((BatchNorm *)
                         ((long)&this->_vptr_BatchNorm_x86_avx +
                         (long)this->_vptr_BatchNorm_x86_avx[-3]),bottom_top_blob,opt);
      return iVar9;
    }
    pp_Var6 = this->_vptr_BatchNorm_x86_avx;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var6[-3])) {
      uVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var7 = this->_vptr_BatchNorm_x86_avx;
      lVar14 = 0;
      auVar23._8_8_ = 0x8000000000000000;
      auVar23._0_8_ = 0x8000000000000000;
      auVar21 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
      do {
        pauVar17 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar14 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar3 = *(float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var7[-3]) + lVar14 * 4);
        auVar24._4_4_ = fVar3;
        auVar24._0_4_ = fVar3;
        auVar24._8_4_ = fVar3;
        auVar24._12_4_ = fVar3;
        fVar4 = *(float *)(*(long *)(&this->field_0x240 + (long)pp_Var7[-3]) + lVar14 * 4);
        auVar25._4_4_ = fVar4;
        auVar25._0_4_ = fVar4;
        auVar25._8_4_ = fVar4;
        auVar25._12_4_ = fVar4;
        if ((int)uVar11 < 8) {
          uVar19 = 0;
        }
        else {
          iVar9 = 7;
          do {
            auVar27._0_4_ = fVar4 * *(float *)*pauVar17 + fVar3;
            auVar27._4_4_ = fVar4 * *(float *)((long)*pauVar17 + 4) + fVar3;
            auVar27._8_4_ = fVar4 * *(float *)((long)*pauVar17 + 8) + fVar3;
            auVar27._12_4_ = fVar4 * *(float *)((long)*pauVar17 + 0xc) + fVar3;
            auVar27._16_4_ = fVar4 * *(float *)((long)*pauVar17 + 0x10) + fVar3;
            auVar27._20_4_ = fVar4 * *(float *)((long)*pauVar17 + 0x14) + fVar3;
            auVar27._24_4_ = fVar4 * *(float *)((long)*pauVar17 + 0x18) + fVar3;
            auVar27._28_4_ = in_ZMM6._28_4_ + fVar3;
            in_ZMM6 = ZEXT3264(auVar27);
            *pauVar17 = auVar27;
            pauVar17 = pauVar17 + 1;
            iVar9 = iVar9 + 8;
            uVar19 = uVar11 & 0xfffffff8;
          } while (iVar9 < (int)uVar11);
        }
        if ((int)(uVar19 | 3) < (int)uVar11) {
          auVar26 = vshufps_avx(auVar24,auVar24,0);
          in_ZMM6 = ZEXT1664(auVar26);
          auVar8 = vshufps_avx(auVar25,auVar25,0);
          uVar20 = uVar19;
          do {
            auVar28._0_4_ = auVar8._0_4_ * *(float *)*pauVar17 + auVar26._0_4_;
            auVar28._4_4_ = auVar8._4_4_ * *(float *)((long)*pauVar17 + 4) + auVar26._4_4_;
            auVar28._8_4_ = auVar8._8_4_ * *(float *)((long)*pauVar17 + 8) + auVar26._8_4_;
            auVar28._12_4_ = auVar8._12_4_ * *(float *)((long)*pauVar17 + 0xc) + auVar26._12_4_;
            *(undefined1 (*) [16])*pauVar17 = auVar28;
            pauVar17 = (undefined1 (*) [32])((long)*pauVar17 + 0x10);
            uVar19 = uVar20 + 4;
            iVar9 = uVar20 + 7;
            uVar20 = uVar19;
          } while (iVar9 < (int)uVar11);
        }
        if ((int)uVar19 < (int)uVar11) {
          uVar12 = CONCAT44(0,~uVar19 + uVar11);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar12;
          auVar26 = vpshufd_avx(auVar26,0x44);
          auVar8 = vshufps_avx(auVar25,auVar25,0);
          auVar28 = vshufps_avx(auVar24,auVar24,0);
          auVar24 = vorps_avx(auVar26,auVar23);
          in_ZMM6 = ZEXT1664(auVar24);
          auVar25 = vorps_avx(auVar26,auVar23);
          auVar26 = vorps_avx(auVar26,auVar23);
          uVar13 = 0;
          do {
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar13;
            auVar29 = vpshufd_avx(auVar29,0x44);
            auVar31._16_16_ = auVar29;
            auVar31._0_16_ = auVar29;
            auVar27 = vorps_avx(auVar31,auVar22);
            auVar31 = vorps_avx(auVar31,auVar5);
            auVar35._0_8_ = auVar31._16_8_ ^ 0x8000000000000000;
            auVar35._8_4_ = auVar31._24_4_;
            auVar35._12_4_ = auVar31._28_4_ ^ 0x80000000;
            auVar29 = vpcmpgtq_avx(auVar35,auVar24);
            auVar30._0_8_ = auVar31._0_8_ ^ 0x8000000000000000;
            auVar30._8_4_ = auVar31._8_4_;
            auVar30._12_4_ = auVar31._12_4_ ^ 0x80000000;
            auVar30 = vpcmpgtq_avx(auVar30,auVar25);
            auVar29 = vpackssdw_avx(auVar30,auVar29);
            auVar36._0_8_ = auVar27._16_8_ ^ 0x8000000000000000;
            auVar36._8_4_ = auVar27._24_4_;
            auVar36._12_4_ = auVar27._28_4_ ^ 0x80000000;
            auVar30 = vpcmpgtq_avx(auVar36,auVar24);
            auVar33._0_8_ = auVar27._0_8_ ^ 0x8000000000000000;
            auVar33._8_4_ = auVar27._8_4_;
            auVar33._12_4_ = auVar27._12_4_ ^ 0x80000000;
            auVar33 = vpcmpgtq_avx(auVar33,auVar26);
            auVar30 = vpackssdw_avx(auVar33,auVar30);
            auVar29 = vpackssdw_avx(auVar30 ^ auVar21,auVar29 ^ auVar21);
            auVar30 = vpmovsxwd_avx(auVar29);
            auVar29 = vpunpckhwd_avx(auVar29,auVar29);
            auVar32._16_16_ = auVar29;
            auVar32._0_16_ = auVar30;
            auVar27 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])((long)*pauVar17 + uVar13 * 4));
            auVar34._0_4_ = auVar27._0_4_ * auVar8._0_4_ + auVar28._0_4_;
            auVar34._4_4_ = auVar27._4_4_ * auVar8._4_4_ + auVar28._4_4_;
            auVar34._8_4_ = auVar27._8_4_ * auVar8._8_4_ + auVar28._8_4_;
            auVar34._12_4_ = auVar27._12_4_ * auVar8._12_4_ + auVar28._12_4_;
            auVar34._16_4_ = auVar27._16_4_ * auVar8._0_4_ + auVar28._0_4_;
            auVar34._20_4_ = auVar27._20_4_ * auVar8._4_4_ + auVar28._4_4_;
            auVar34._24_4_ = auVar27._24_4_ * auVar8._8_4_ + auVar28._8_4_;
            auVar34._28_4_ = auVar27._28_4_ + auVar28._12_4_;
            auVar27 = vmaskmovps_avx(auVar32,auVar34);
            *(undefined1 (*) [32])((long)*pauVar17 + uVar13 * 4) = auVar27;
            uVar13 = uVar13 + 8;
          } while ((uVar12 + 8 & 0xfffffffffffffff8) != uVar13);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < *(int *)(&this->field_0xd0 + (long)pp_Var6[-3]));
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}